

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

void __thiscall
ktx::Command::parseCommandLine(Command *this,string *name,string *desc,int argc,char **argv)

{
  pointer pcVar1;
  ParseResult args;
  Options commandOpts;
  string local_3e0;
  string local_3c0;
  long *local_3a0 [2];
  long local_390 [2];
  ParseResult local_380;
  OptionParser local_2c8;
  ParseResult local_210;
  undefined1 local_158 [129];
  bool local_d7;
  size_t local_d0;
  element_type *local_c0;
  PositionalList local_b0 [5];
  
  std::__cxx11::string::_M_assign((string *)&this->super_Reporter);
  std::__cxx11::string::_M_assign((string *)&(this->super_Reporter).commandDescription);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c0,pcVar1,pcVar1 + name->_M_string_length);
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"");
  cxxopts::Options::Options((Options *)local_158,&local_3c0,&local_3e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  local_3a0[0] = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"[OPTION...]","");
  std::__cxx11::string::operator=((string *)(local_158 + 0x40),(string *)local_3a0);
  if (local_3a0[0] != local_390) {
    operator_delete(local_3a0[0],local_390[0] + 1);
  }
  local_d0 = 100;
  (*this->_vptr_Command[3])(this);
  local_380.m_keys._M_h._M_buckets = &local_380.m_keys._M_h._M_single_bucket;
  local_380.m_keys._M_h._M_bucket_count = 1;
  local_380.m_keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_380.m_keys._M_h._M_element_count = 0;
  local_380.m_keys._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_380.m_keys._M_h._M_rehash_policy._4_4_ = 0;
  local_380.m_values._M_h._M_buckets = &local_380.m_values._M_h._M_single_bucket;
  local_380.m_keys._M_h._M_rehash_policy._M_next_resize = 0;
  local_380.m_keys._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_380.m_values._M_h._M_bucket_count = 1;
  local_380.m_values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_380.m_values._M_h._M_element_count = 0;
  local_380.m_values._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_380.m_values._M_h._M_rehash_policy._4_4_ = 0;
  local_380.m_values._M_h._M_rehash_policy._M_next_resize = 0;
  local_380.m_values._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_380.m_sequential.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_380.m_sequential.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_380.m_sequential.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_380.m_defaults.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_380.m_defaults.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_380.m_defaults.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_380.m_unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_380.m_unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_380.m_unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8.m_positional = local_b0;
  local_2c8.m_parsed._M_h._M_buckets = &local_2c8.m_parsed._M_h._M_single_bucket;
  local_2c8.m_options = local_c0;
  local_2c8.m_sequential.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.m_sequential.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.m_sequential.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8.m_defaults.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.m_defaults.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.m_defaults.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8.m_allow_unrecognised = local_d7;
  local_2c8.m_parsed._M_h._M_bucket_count = 1;
  local_2c8.m_parsed._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2c8.m_parsed._M_h._M_element_count = 0;
  local_2c8.m_parsed._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_2c8.m_parsed._M_h._M_rehash_policy._4_4_ = 0;
  local_2c8.m_keys._M_h._M_buckets = &local_2c8.m_keys._M_h._M_single_bucket;
  local_2c8.m_parsed._M_h._M_rehash_policy._M_next_resize = 0;
  local_2c8.m_parsed._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_2c8.m_keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2c8.m_keys._M_h._M_element_count = 0;
  local_2c8.m_keys._M_h._M_bucket_count = 1;
  local_2c8.m_keys._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_2c8.m_keys._M_h._M_rehash_policy._4_4_ = 0;
  local_2c8.m_keys._M_h._M_rehash_policy._M_next_resize = 0;
  local_2c8.m_keys._M_h._M_single_bucket = (__node_base_ptr)0x0;
  cxxopts::OptionParser::parse(&local_210,&local_2c8,argc,argv);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_2c8.m_keys._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_2c8.m_parsed._M_h);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_2c8.m_defaults)
  ;
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
            (&local_2c8.m_sequential);
  cxxopts::ParseResult::operator=(&local_380,&local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_210.m_unmatched);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_210.m_defaults)
  ;
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
            (&local_210.m_sequential);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_210.m_values._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_210);
  (*this->_vptr_Command[4])(this,local_158,&local_380);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_380.m_unmatched);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_380.m_defaults)
  ;
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
            (&local_380.m_sequential);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_380.m_values._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_380);
  cxxopts::Options::~Options((Options *)local_158);
  return;
}

Assistant:

void Command::parseCommandLine(const std::string& name, const std::string& desc, int argc, char* argv[]) {
    commandName = name;
    commandDescription = desc;

    cxxopts::Options commandOpts(name, "");
    commandOpts.custom_help("[OPTION...]");
    commandOpts.set_width(CONSOLE_USAGE_WIDTH);
    initOptions(commandOpts); // virtual customization point

    cxxopts::ParseResult args;
    try {
        args = commandOpts.parse(argc, argv);
        processOptions(commandOpts, args); // virtual customization point

    } catch (const cxxopts::exceptions::parsing& ex) {
        fatal_usage("{}.", ex.what());
    }

#if defined(_WIN32) && defined(DEBUG)
    if (args["ld"].as<bool>())
        launchDebugger();
#endif
}